

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

char __thiscall capnp::anon_unknown_79::Input::nextChar(Input *this)

{
  Fault f;
  Fault local_10;
  
  if (((this->wrapped).size_ != 0) && (*(this->wrapped).ptr != '\0')) {
    return *(this->wrapped).ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x21a,FAILED,"!exhausted()","\"JSON message ends prematurely.\"",
             (char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

bool exhausted() {
    return wrapped.size() == 0 || wrapped.front() == '\0';
  }